

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O3

optional<jbcoin::STObject> *
jbcoin::STParsedJSONDetail::parseObject
          (optional<jbcoin::STObject> *__return_storage_ptr__,string *json_name,Value *json,
          SField *inName,int depth,Value *error)

{
  atomic<int> *paVar1;
  char cVar2;
  ushort uVar3;
  SerializedTypeID SVar4;
  pointer pcVar5;
  undefined1 uVar6;
  ResultOfSetTypeFromSField RVar7;
  Counter *pCVar8;
  SField *pSVar9;
  SField *inName_00;
  long *plVar10;
  undefined8 *puVar11;
  optional<jbcoin::STObject> *extraout_RAX;
  optional<jbcoin::STObject> *extraout_RAX_00;
  size_type *psVar12;
  long *plVar13;
  undefined1 uVar14;
  Value *error_00;
  ValueHolder VVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  optional<jbcoin::detail::STVar> array;
  STObject data;
  string local_140;
  string local_120;
  string *local_100;
  ValueHolder local_f8;
  undefined1 local_f0 [16];
  pointer pSStack_e0;
  long *local_98;
  ValueHolder local_88;
  ushort local_80;
  undefined6 uStack_7e;
  STObject local_70;
  SField *local_40;
  char *local_38;
  
  if ((json->field_0x8 == '\0') || (json->field_0x8 == '\a')) {
    if (depth < 0x41) {
      local_70.super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002d3040;
      error_00 = error;
      local_70.super_STBase.fName = inName;
      local_40 = inName;
      pCVar8 = CountedObject<jbcoin::STObject>::getCounter();
      LOCK();
      paVar1 = &(pCVar8->super_CounterBase).m_count;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      local_70.super_STBase._vptr_STBase = (_func_int **)&PTR__STObject_002d31a0;
      local_70.v_.super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_70.v_.super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_70.v_.super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70.mType = (SOTemplate *)0x0;
      Json::Value::getMemberNames_abi_cxx11_((Members *)&local_88,json);
      local_38 = (char *)CONCAT62(uStack_7e,local_80);
      if (local_88.string_ != local_38) {
        VVar15 = local_88;
        local_100 = json_name;
        do {
          pSVar9 = (SField *)Json::Value::operator[](json,*VVar15.string_);
          inName_00 = SField::getField((string *)VVar15.map_);
          if (inName_00->fieldCode == sfInvalid) {
            unknown_field((string *)&local_f8,(string *)(json_name->_M_dataplus)._M_p);
LAB_001b578e:
            VVar15 = error->value_;
            error->value_ = local_f8;
            uVar3 = *(ushort *)&error->field_0x8;
            *(ushort *)&error->field_0x8 = local_f0._0_2_ & 0x1ff | uVar3 & 0xfe00;
            local_f0._0_2_ = uVar3 & 0x1ff | local_f0._0_2_ & 0xfe00;
            local_f8 = VVar15;
            Json::Value::~Value((Value *)&local_f8);
            (__return_storage_ptr__->super_type).m_initialized = false;
LAB_001b57e1:
            beast::unit_test::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_88);
            goto LAB_001b57ee;
          }
          SVar4 = inName_00->fieldType;
          if ((uint)(SVar4 + 0xffffd8ef) < 3) {
LAB_001b522a:
            cVar2 = (char)pSVar9->fieldValue;
            if ((cVar2 != '\0') && (cVar2 != '\a')) {
              not_an_object((string *)&local_f8,(string *)(json_name->_M_dataplus)._M_p);
              goto LAB_001b578e;
            }
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            pcVar5 = (json_name->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,pcVar5,pcVar5 + json_name->_M_string_length);
            std::__cxx11::string::append((char *)&local_120);
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_120,*(ulong *)VVar15.string_);
            json_name = local_100;
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            psVar12 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_140.field_2._M_allocated_capacity = *psVar12;
              local_140.field_2._8_8_ = plVar10[3];
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar12;
              local_140._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_140._M_string_length = plVar10[1];
            *plVar10 = (long)psVar12;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            error_00 = error;
            parseObject((optional<jbcoin::STObject> *)&local_f8,&local_140,(Value *)pSVar9,inName_00
                        ,depth + 1,error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            uVar14 = local_f8.bool_;
            if (local_f8.bool_ == false) {
              (__return_storage_ptr__->super_type).m_initialized = false;
              uVar6 = 0;
            }
            else {
              std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::
              emplace_back<jbcoin::STObject>(&local_70.v_,(STObject *)local_f0);
              uVar6 = local_f8.bool_;
            }
            if ((uVar6 & 1) != 0) {
              STObject::~STObject((STObject *)local_f0);
            }
          }
          else {
            if (SVar4 == STI_ARRAY) {
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              pcVar5 = (json_name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_120,pcVar5,pcVar5 + json_name->_M_string_length);
              std::__cxx11::string::append((char *)&local_120);
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_120,*(ulong *)VVar15.string_);
              json_name = local_100;
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              psVar12 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_140.field_2._M_allocated_capacity = *psVar12;
                local_140.field_2._8_8_ = plVar10[3];
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar12;
                local_140._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_140._M_string_length = plVar10[1];
              *plVar10 = (long)psVar12;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              error_00 = error;
              parseArray((optional<jbcoin::detail::STVar> *)&local_f8,&local_140,(Value *)pSVar9,
                         inName_00,depth + 1,error);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              uVar14 = local_f8.bool_;
              if (local_f8.bool_ != false) {
                std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::
                emplace_back<jbcoin::detail::STVar>(&local_70.v_,(STVar *)(local_f0 + 8));
                goto LAB_001b5494;
              }
LAB_001b549a:
              (__return_storage_ptr__->super_type).m_initialized = false;
              uVar6 = uVar14;
            }
            else {
              if (SVar4 == STI_OBJECT) goto LAB_001b522a;
              parseLeaf((optional<jbcoin::detail::STVar> *)&local_f8,json_name,(string *)VVar15.map_
                        ,pSVar9,error,error_00);
              uVar14 = local_f8.bool_;
              if (local_f8.bool_ == false) goto LAB_001b549a;
              std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::
              emplace_back<jbcoin::detail::STVar>(&local_70.v_,(STVar *)(local_f0 + 8));
LAB_001b5494:
              uVar6 = local_f8.bool_;
            }
            if ((uVar6 & 1) != 0) {
              if (local_98 == (long *)(local_f0 + 8)) {
                puVar11 = (undefined8 *)*local_98;
              }
              else {
                if (local_98 == (long *)0x0) goto LAB_001b54cd;
                puVar11 = (undefined8 *)(*local_98 + 8);
              }
              (*(code *)*puVar11)();
            }
          }
LAB_001b54cd:
          if (uVar14 == 0) goto LAB_001b57e1;
          VVar15.string_ =
               (char *)&((VVar15.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
        } while (VVar15.string_ != local_38);
      }
      beast::unit_test::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      pSVar9 = local_40;
      RVar7 = STObject::setTypeFromSField(&local_70,local_40);
      if (RVar7 == typeSetFail) {
        SField::getName_abi_cxx11_(&local_120,pSVar9);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x27f66b);
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_140.field_2._M_allocated_capacity = *psVar12;
          local_140.field_2._8_8_ = plVar10[3];
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar12;
          local_140._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_140._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
        plVar13 = plVar10 + 2;
        if ((long *)*plVar10 == plVar13) {
          local_f0._8_8_ = *plVar13;
          pSStack_e0 = (pointer)plVar10[3];
          local_f8.string_ = local_f0 + 8;
        }
        else {
          local_f0._8_8_ = *plVar13;
          local_f8.string_ = (char *)*plVar10;
        }
        local_f0._0_8_ = plVar10[1];
        *plVar10 = (long)plVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        RPC::make_error((RPC *)&local_88.bool_,rpcINVALID_PARAMS,(string *)&local_f8);
        if (local_f8.string_ != local_f0 + 8) {
          operator_delete(local_f8.string_,(ulong)((long)(int *)local_f0._8_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        VVar15 = error->value_;
        error->value_ = local_88;
        uVar3 = *(ushort *)&error->field_0x8;
        *(ushort *)&error->field_0x8 = local_80 & 0x1ff | uVar3 & 0xfe00;
        local_80 = uVar3 & 0x1ff | local_80 & 0xfe00;
        local_88 = VVar15;
        Json::Value::~Value((Value *)&local_88);
        (__return_storage_ptr__->super_type).m_initialized = false;
      }
      else {
        (__return_storage_ptr__->super_type).m_initialized = false;
        (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ = (type)&PTR__STBase_002d3040
        ;
        *(SField **)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
             local_70.super_STBase.fName;
        pCVar8 = CountedObject<jbcoin::STObject>::getCounter();
        LOCK();
        paVar1 = &(pCVar8->super_CounterBase).m_count;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
             (type)&PTR__STObject_002d31a0;
        *(pointer *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10) =
             local_70.v_.
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x18) =
             local_70.v_.
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x20) =
             local_70.v_.
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_70.v_.
        super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_70.v_.
        super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_70.v_.
        super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(SOTemplate **)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x28) =
             local_70.mType;
        (__return_storage_ptr__->super_type).m_initialized = true;
      }
LAB_001b57ee:
      STObject::~STObject(&local_70);
      return extraout_RAX_00;
    }
    too_deep((STParsedJSONDetail *)&local_f8.bool_,json_name);
  }
  else {
    not_an_object((STParsedJSONDetail *)&local_f8.bool_,json_name);
  }
  VVar15 = error->value_;
  error->value_ = local_f8;
  uVar3 = *(ushort *)&error->field_0x8;
  *(ushort *)&error->field_0x8 = local_f0._0_2_ & 0x1ff | uVar3 & 0xfe00;
  local_f0._0_2_ = uVar3 & 0x1ff | local_f0._0_2_ & 0xfe00;
  local_f8 = VVar15;
  Json::Value::~Value((Value *)&local_f8);
  (__return_storage_ptr__->super_type).m_initialized = false;
  return extraout_RAX;
}

Assistant:

static boost::optional <STObject> parseObject (
    std::string const& json_name,
    Json::Value const& json,
    SField const& inName,
    int depth,
    Json::Value& error)
{
    if (! json.isObject ())
    {
        error = not_an_object (json_name);
        return boost::none;
    }

    if (depth > maxDepth)
    {
        error = too_deep (json_name);
        return boost::none;
    }

    STObject data (inName);

    for (auto const& fieldName : json.getMemberNames ())
    {
        Json::Value const& value = json [fieldName];

        auto const& field = SField::getField (fieldName);

        if (field == sfInvalid)
        {
            error = unknown_field (json_name, fieldName);
            return boost::none;
        }

        switch (field.fieldType)
        {

        // Object-style containers (which recurse).
        case STI_OBJECT:
        case STI_TRANSACTION:
        case STI_LEDGERENTRY:
        case STI_VALIDATION:
            if (! value.isObject ())
            {
                error = not_an_object (json_name, fieldName);
                return boost::none;
            }

            try
            {
                auto ret = parseObject (json_name + "." + fieldName,
                    value, field, depth + 1, error);
                if (! ret)
                    return boost::none;
                data.emplace_back (std::move (*ret));
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return boost::none;
            }

            break;

        // Array-style containers (which recurse).
        case STI_ARRAY:
            try
            {
                auto array = parseArray (json_name + "." + fieldName,
                    value, field, depth + 1, error);
                if (array == boost::none)
                    return boost::none;
                data.emplace_back (std::move (*array));
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return boost::none;
            }

            break;

        // Everything else (types that don't recurse).
        default:
            {
                auto leaf =
                    parseLeaf (json_name, fieldName, &inName, value, error);

                if (!leaf)
                    return boost::none;

                data.emplace_back (std::move (*leaf));
            }

            break;
        }
    }

    // Some inner object types have templates.  Attempt to apply that.
    if (data.setTypeFromSField (inName) == STObject::typeSetFail)
    {
        error = template_mismatch (inName);
        return boost::none;
    }

    return std::move (data);
}